

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_homogeneous_coordinates_Test_Test::TestBody
          (utObjImportExport_homogeneous_coordinates_Test_Test *this)

{
  bool bVar1;
  size_t pLength;
  char *pcVar2;
  AssertHelper local_198;
  Message local_190;
  float local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  Message local_168;
  float local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_6;
  Message local_140;
  float local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_5;
  aiVector3D vertice;
  Message local_108;
  uint local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  aiFace face;
  Message local_d0;
  uint local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  uint local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  aiMesh *mesh;
  Message local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer myimporter;
  utObjImportExport_homogeneous_coordinates_Test_Test *this_local;
  
  myimporter.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  pcVar2 = TestBody::ObjModel;
  pLength = strlen(TestBody::ObjModel);
  local_20 = Assimp::Importer::ReadFileFromMemory((Importer *)&scene,pcVar2,pLength,0x400,"");
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x156,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_6c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_68,"scene->mNumMeshes","1U",&local_20->mNumMeshes,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mesh,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_20->mMeshes;
  local_9c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_98,"mesh->mNumVertices","3U",
             &((aiMesh *)gtest_ar_2.message_.ptr_)->mNumVertices,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_c0,"mesh->mNumFaces","1U",
             (uint *)&(gtest_ar_2.message_.ptr_)->_M_string_length,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&face.mIndices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&face.mIndices,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&face.mIndices);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  aiFace::aiFace((aiFace *)&gtest_ar_4.message_,
                 (aiFace *)gtest_ar_2.message_.ptr_[6].field_2._M_allocated_capacity);
  local_fc = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_f8,"face.mNumIndices","3U",(uint *)&gtest_ar_4.message_,
             &local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vertice.z,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vertice.z,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vertice.z);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  vertice.x = *(float *)((undefined8 *)((gtest_ar_2.message_.ptr_)->field_2)._M_allocated_capacity +
                        1);
  gtest_ar_5.message_.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((gtest_ar_2.message_.ptr_)->field_2)._M_allocated_capacity;
  local_134 = -1.0;
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_130,"vertice.x","-1.0f",(float *)&gtest_ar_5.message_,
             &local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_15c = 0.0;
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_158,"vertice.y","0.0f",
             (float *)((long)&gtest_ar_5.message_.ptr_ + 4),&local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_184 = 0.8;
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_180,"vertice.z","0.8f",&vertice.x,&local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x161,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  aiFace::~aiFace((aiFace *)&gtest_ar_4.message_);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utObjImportExport, homogeneous_coordinates_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000 0.50000\n"
        "v -0.500000 0.000000 -0.800000 1.00000\n"
        "v 0.500000 1.000000 -0.800000 0.5000\n"
        "f 1 2 3\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 3U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 3U);
    const aiVector3D vertice = mesh->mVertices[0];
    EXPECT_EQ(vertice.x, -1.0f);
    EXPECT_EQ(vertice.y, 0.0f);
    EXPECT_EQ(vertice.z, 0.8f);
}